

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  pointer ppVar6;
  LogMessage *pLVar7;
  int __c;
  LogMessage local_68;
  Voidify local_55;
  int local_54;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
  local_50;
  OneofDescriptor *local_38;
  OneofDescriptor *oneof;
  uint local_1c;
  Descriptor *pDStack_18;
  int i;
  Descriptor *descriptor_local;
  MessageGenerator *this_local;
  
  this->_vptr_MessageGenerator = (_func_int **)&PTR__MessageGenerator_00ef8dd0;
  this->descriptor_ = descriptor;
  pDStack_18 = descriptor;
  descriptor_local = (Descriptor *)this;
  absl::lts_20250127::
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  ::btree_map(&this->oneofs_);
  local_1c = 0;
  do {
    uVar1 = local_1c;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (iVar3 <= (int)uVar1) {
      return;
    }
    pFVar4 = Descriptor::field(this->descriptor_,local_1c);
    bVar2 = IsRealOneof(pFVar4);
    if (bVar2) {
      pcVar5 = (char *)(ulong)local_1c;
      pFVar4 = Descriptor::field(this->descriptor_,local_1c);
      local_38 = FieldDescriptor::containing_oneof(pFVar4);
      pcVar5 = OneofDescriptor::index(local_38,pcVar5,__c);
      local_54 = (int)pcVar5;
      absl::lts_20250127::container_internal::
      btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>>
      ::emplace<int,google::protobuf::OneofDescriptor_const*&>
                (&local_50,&this->oneofs_,&local_54,&local_38);
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator->(&local_50.first);
      if (ppVar6->second != local_38) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/full/message.cc"
                   ,0x45,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
        pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_55,pLVar7);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_68);
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor)
    : descriptor_(descriptor) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
}